

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O0

FT_Error cff_index_get_pointers(CFF_Index idx,FT_Byte ***table,FT_Byte **pool,FT_ULong *pool_size)

{
  FT_Memory memory_00;
  FT_Byte **ppFVar1;
  FT_ULong size;
  long *plVar2;
  FT_Byte **local_78;
  FT_ULong next_offset;
  FT_Byte *org_bytes;
  FT_ULong extra;
  FT_ULong cur_offset;
  FT_ULong n;
  FT_ULong new_size;
  FT_Byte *new_bytes;
  FT_Byte **t;
  FT_Memory memory;
  FT_ULong *pFStack_28;
  FT_Error error;
  FT_ULong *pool_size_local;
  FT_Byte **pool_local;
  FT_Byte ***table_local;
  CFF_Index idx_local;
  
  memory._4_4_ = 0;
  memory_00 = idx->stream->memory;
  new_size = 0;
  *table = (FT_Byte **)0x0;
  pFStack_28 = pool_size;
  pool_size_local = (FT_ULong *)pool;
  pool_local = (FT_Byte **)table;
  table_local = (FT_Byte ***)idx;
  if ((((idx->offsets != (FT_ULong *)0x0) ||
       (memory._4_4_ = cff_index_load_offsets(idx), memory._4_4_ == 0)) &&
      (size = (long)table_local[5] + (ulong)*(uint *)((long)table_local + 0x14),
      *(int *)((long)table_local + 0x14) != 0)) &&
     ((plVar2 = (long *)ft_mem_realloc(memory_00,8,0,(ulong)(*(int *)((long)table_local + 0x14) + 1)
                                       ,(void *)0x0,(FT_Error *)((long)&memory + 4)),
      memory._4_4_ == 0 &&
      ((pool_size_local == (FT_ULong *)0x0 ||
       (new_size = (FT_ULong)ft_mem_alloc(memory_00,size,(FT_Error *)((long)&memory + 4)),
       memory._4_4_ == 0)))))) {
    org_bytes = (FT_Byte *)0x0;
    ppFVar1 = table_local[7];
    extra = (FT_ULong)(*table_local[6] + -1);
    if ((FT_Byte *)extra != (FT_Byte *)0x0) {
      extra = 0;
    }
    if (pool_size_local == (FT_ULong *)0x0) {
      *plVar2 = (long)ppFVar1 + extra;
    }
    else {
      *plVar2 = new_size + extra;
    }
    for (cur_offset = 1; cur_offset <= *(uint *)((long)table_local + 0x14);
        cur_offset = cur_offset + 1) {
      local_78 = (FT_Byte **)(table_local[6][cur_offset] + -1);
      if (local_78 < extra) {
        local_78 = (FT_Byte **)extra;
      }
      else if (table_local[5] < local_78) {
        local_78 = table_local[5];
      }
      if (pool_size_local == (FT_ULong *)0x0) {
        plVar2[cur_offset] = (long)((long)ppFVar1 + (long)local_78);
      }
      else {
        plVar2[cur_offset] = (long)((FT_Byte *)(new_size + (long)local_78) + (long)org_bytes);
        if (local_78 != (FT_Byte **)extra) {
          memcpy((void *)plVar2[cur_offset - 1],(void *)((long)ppFVar1 + extra),
                 plVar2[cur_offset] - plVar2[cur_offset - 1]);
          *(undefined1 *)plVar2[cur_offset] = 0;
          plVar2[cur_offset] = plVar2[cur_offset] + 1;
          org_bytes = org_bytes + 1;
        }
      }
      extra = (FT_ULong)local_78;
    }
    *pool_local = (FT_Byte *)plVar2;
    if (pool_size_local != (FT_ULong *)0x0) {
      *pool_size_local = new_size;
    }
    if (pFStack_28 != (FT_ULong *)0x0) {
      *pFStack_28 = size;
    }
  }
  return memory._4_4_;
}

Assistant:

static FT_Error
  cff_index_get_pointers( CFF_Index   idx,
                          FT_Byte***  table,
                          FT_Byte**   pool,
                          FT_ULong*   pool_size )
  {
    FT_Error   error     = FT_Err_Ok;
    FT_Memory  memory    = idx->stream->memory;

    FT_Byte**  t         = NULL;
    FT_Byte*   new_bytes = NULL;
    FT_ULong   new_size;


    *table = NULL;

    if ( !idx->offsets )
    {
      error = cff_index_load_offsets( idx );
      if ( error )
        goto Exit;
    }

    new_size = idx->data_size + idx->count;

    if ( idx->count > 0                                &&
         !FT_NEW_ARRAY( t, idx->count + 1 )            &&
         ( !pool || !FT_ALLOC( new_bytes, new_size ) ) )
    {
      FT_ULong  n, cur_offset;
      FT_ULong  extra = 0;
      FT_Byte*  org_bytes = idx->bytes;


      /* at this point, `idx->offsets' can't be NULL */
      cur_offset = idx->offsets[0] - 1;

      /* sanity check */
      if ( cur_offset != 0 )
      {
        FT_TRACE0(( "cff_index_get_pointers:"
                    " invalid first offset value %d set to zero\n",
                    cur_offset ));
        cur_offset = 0;
      }

      if ( !pool )
        t[0] = org_bytes + cur_offset;
      else
        t[0] = new_bytes + cur_offset;

      for ( n = 1; n <= idx->count; n++ )
      {
        FT_ULong  next_offset = idx->offsets[n] - 1;


        /* two sanity checks for invalid offset tables */
        if ( next_offset < cur_offset )
          next_offset = cur_offset;
        else if ( next_offset > idx->data_size )
          next_offset = idx->data_size;

        if ( !pool )
          t[n] = org_bytes + next_offset;
        else
        {
          t[n] = new_bytes + next_offset + extra;

          if ( next_offset != cur_offset )
          {
            FT_MEM_COPY( t[n - 1], org_bytes + cur_offset, t[n] - t[n - 1] );
            t[n][0] = '\0';
            t[n]   += 1;
            extra++;
          }
        }

        cur_offset = next_offset;
      }
      *table = t;

      if ( pool )
        *pool = new_bytes;
      if ( pool_size )
        *pool_size = new_size;
    }

  Exit:
    return error;
  }